

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall testing::Matcher<const_int_&>::Matcher(Matcher<const_int_&> *this,int *value)

{
  ComparisonBase<testing::internal::EqMatcher<int>,_int,_testing::internal::AnyEq> local_34;
  Matcher<const_int_&> local_30;
  int *local_18;
  int *value_local;
  Matcher<const_int_&> *this_local;
  
  local_18 = value;
  value_local = (int *)this;
  internal::MatcherBase<const_int_&>::MatcherBase(&this->super_MatcherBase<const_int_&>);
  (this->super_MatcherBase<const_int_&>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__Matcher_0034e410;
  local_34.rhs_ = (int)Eq<int>(*local_18);
  Matcher<int_const&>::Matcher<testing::internal::EqMatcher<int>,void>
            ((Matcher<int_const&> *)&local_30,(EqMatcher<int> *)&local_34);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }